

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall t_netstd_generator::generate_netstd_union(t_netstd_generator *this,t_struct *tunion)

{
  int iVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  ostream *poVar5;
  _Alloc_hider *p_Var6;
  long *plVar7;
  uint uVar8;
  _Alloc_hider this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string f_union_name;
  ofstream_with_content_based_conditional_update f_union;
  char *local_250;
  long local_248;
  char local_240 [16];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [16];
  _Alloc_hider local_1c0;
  long lStack_1b8;
  string local_160 [32];
  undefined1 local_140;
  ios_base local_138 [264];
  
  iVar1 = (this->super_t_oop_generator).super_t_generator.indent_;
  pcVar2 = (this->namespace_dir_)._M_dataplus._M_p;
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar2,pcVar2 + (this->namespace_dir_)._M_string_length);
  std::__cxx11::string::append((char *)&local_250);
  iVar3 = (*(tunion->super_t_type).super_t_doc._vptr_t_doc[3])(tunion);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_250,*(ulong *)CONCAT44(extraout_var,iVar3));
  p_Var6 = (_Alloc_hider *)(plVar4 + 2);
  if ((_Alloc_hider *)*plVar4 == p_Var6) {
    local_1c0._M_p = p_Var6->_M_p;
    lStack_1b8 = plVar4[3];
    local_1d0._0_8_ = &local_1c0;
  }
  else {
    local_1c0._M_p = p_Var6->_M_p;
    local_1d0._0_8_ = (_Alloc_hider *)*plVar4;
  }
  local_1d0._8_8_ = plVar4[1];
  *plVar4 = (long)p_Var6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append(local_1d0);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_220 = *plVar7;
    lStack_218 = plVar4[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar7;
    local_230 = (long *)*plVar4;
  }
  local_228 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((_Alloc_hider *)local_1d0._0_8_ != &local_1c0) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::string((string *)&local_250,(char *)local_230,(allocator *)&local_210);
  std::__cxx11::string::_M_assign(local_160);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  local_140 = 0;
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (0 < (this->super_t_oop_generator).super_t_generator.indent_) {
    (this->super_t_oop_generator).super_t_generator.indent_ = 0;
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_250,this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,local_250,local_248);
  netstd_type_usings_abi_cxx11_(&local_210,this);
  this_00._M_p = local_210._M_dataplus._M_p;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_210._M_dataplus._M_p,local_210._M_string_length);
  netstd_thrift_usings_abi_cxx11_(&local_1f0,(t_netstd_generator *)this_00._M_p);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  poVar5 = (ostream *)local_1d0;
  generate_netstd_union_definition(this,poVar5,tunion);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,(int)poVar5);
  uVar8 = iVar1 - (this->super_t_oop_generator).super_t_generator.indent_;
  if (uVar8 != 0) {
    pverbose("Wrong indent count in %s: difference = %i \n","generate_netstd_union.",(ulong)uVar8);
  }
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,
             &template_ofstream_with_content_based_conditional_update<char,std::char_traits<char>>::
              VTT);
  std::ios_base::~ios_base(local_138);
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_union(t_struct* tunion)
{
    int ic = indent_count();

    string f_union_name = namespace_dir_ + "/" + (tunion->get_name()) + ".cs";
    ofstream_with_content_based_conditional_update f_union;

    f_union.open(f_union_name.c_str());

    reset_indent();
    f_union << autogen_comment() << netstd_type_usings() << netstd_thrift_usings() << endl;

    generate_netstd_union_definition(f_union, tunion);

    f_union.close();

    indent_validate(ic, "generate_netstd_union.");
}